

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_ffi_xof(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef *pTVar2;
  uint uVar3;
  TRef TVar4;
  
  uVar3 = argv2ctype(J,*J->base,rd->argv);
  if (rd->data == 0xc6) {
    uVar3 = J->base[1];
    if ((uVar3 & 0x1f000000) != 0x4000000) {
LAB_00136572:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    TVar4 = lj_ir_kgc(J,(GCobj *)(ulong)rd->argv[1].u32.lo,IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)uVar3;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    rd->nres = 3;
  }
  else if (rd->data == 0xc4) {
    do {
      uVar1 = *(uint *)(*(long *)(ulong)J[-1].bpropcache[9].mode + (ulong)uVar3 * 0x10);
      uVar3 = uVar1 & 0xffff;
    } while ((uVar1 & 0xf0800000) == 0x20800000);
    if ((uVar1 & 0xd0100000) == 0x10100000) goto LAB_00136572;
  }
  J->postproc = LJ_POST_FIXCONST;
  pTVar2 = J->base;
  pTVar2[2] = 0x7fff;
  pTVar2[0] = 0x7fff;
  pTVar2[1] = 0x7fff;
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_xof(jit_State *J, RecordFFData *rd)
{
  CTypeID id = argv2ctype(J, J->base[0], &rd->argv[0]);
  if (rd->data == FF_ffi_sizeof) {
    CType *ct = lj_ctype_rawref(ctype_ctsG(J2G(J)), id);
    if (ctype_isvltype(ct->info))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  } else if (rd->data == FF_ffi_offsetof) {  /* Specialize to the field name. */
    if (!tref_isstr(J->base[1]))
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    emitir(IRTG(IR_EQ, IRT_STR), J->base[1], lj_ir_kstr(J, strV(&rd->argv[1])));
    rd->nres = 3;  /* Just in case. */
  }
  J->postproc = LJ_POST_FIXCONST;
  J->base[0] = J->base[1] = J->base[2] = TREF_NIL;
}